

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QXmlStreamNotationDeclaration>::resize
          (QList<QXmlStreamNotationDeclaration> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QXmlStreamNotationDeclaration> *in_RSI;
  QArrayDataPointer<QXmlStreamNotationDeclaration> *in_RDI;
  QList<QXmlStreamNotationDeclaration> *unaff_retaddr;
  QArrayDataPointer<QXmlStreamNotationDeclaration> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QXmlStreamNotationDeclaration>::size((QList<QXmlStreamNotationDeclaration> *)in_RDI)
  ;
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QXmlStreamNotationDeclaration>::operator->(in_RDI);
    QArrayDataPointer<QXmlStreamNotationDeclaration>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }